

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModel.cpp
# Opt level: O0

Identifier * __thiscall psy::C::SemanticModel::freshSyntheticTag(SemanticModel *this)

{
  uint size;
  pointer pSVar1;
  size_type __val;
  Identifier *this_00;
  char *chars;
  reference pvVar2;
  Identifier *ident;
  undefined1 local_88 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
  p;
  string local_50;
  undefined1 local_30 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> tag;
  SemanticModel *this_local;
  
  tag.field_2._8_8_ = this;
  std::
  unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
  ::operator->(&this->impl_);
  pSVar1 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  __val = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>_>_>
          ::size(&pSVar1->syntheticTags_);
  std::__cxx11::to_string(&local_50,__val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &SemanticModelImpl::syntheticTagPrefix__abi_cxx11_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ident = (Identifier *)0x0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::nullptr_t,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
              *)local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&ident);
  pSVar1 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  std::
  vector<std::pair<std::__cxx11::string,psy::C::Identifier*>,std::allocator<std::pair<std::__cxx11::string,psy::C::Identifier*>>>
  ::emplace_back<std::pair<std::__cxx11::string,psy::C::Identifier*>>
            ((vector<std::pair<std::__cxx11::string,psy::C::Identifier*>,std::allocator<std::pair<std::__cxx11::string,psy::C::Identifier*>>>
              *)&pSVar1->syntheticTags_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
              *)local_88);
  this_00 = (Identifier *)operator_new(0x30);
  pSVar1 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>_>_>
  ::back(&pSVar1->syntheticTags_);
  chars = (char *)std::__cxx11::string::c_str();
  pSVar1 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>_>_>
  ::back(&pSVar1->syntheticTags_);
  size = std::__cxx11::string::length();
  Identifier::Identifier(this_00,chars,size);
  pSVar1 = std::
           unique_ptr<psy::C::SemanticModel::SemanticModelImpl,_std::default_delete<psy::C::SemanticModel::SemanticModelImpl>_>
           ::operator->(&this->impl_);
  pvVar2 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>_>_>
           ::back(&pSVar1->syntheticTags_);
  pvVar2->second = this_00;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_psy::C::Identifier_*>
           *)local_88);
  std::__cxx11::string::~string((string *)local_30);
  return this_00;
}

Assistant:

const Identifier* SemanticModel::freshSyntheticTag()
{
    auto tag = P->syntheticTagPrefix_ + std::to_string(P->syntheticTags_.size());
    std::pair<std::string, Identifier*> p(std::move(tag), nullptr);
    P->syntheticTags_.emplace_back(std::move(p));
    auto ident = new Identifier(
                P->syntheticTags_.back().first.c_str(),
                P->syntheticTags_.back().first.length());
    P->syntheticTags_.back().second = ident;
    return ident;
}